

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall
Buffer_peek_string_no_len_arg_Test::TestBody(Buffer_peek_string_no_len_arg_Test *this)

{
  bool bVar1;
  const_pointer pvVar2;
  size_type len;
  char *pcVar3;
  AssertHelper local_c8;
  Message local_c0 [3];
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  bfy_buffer buf;
  Buffer_peek_string_no_len_arg_Test *this_local;
  
  bfy_buffer_init();
  pvVar2 = std::data<std::basic_string_view<char,std::char_traits<char>>>
                     ((basic_string_view<char,_std::char_traits<char>_> *)
                      (anonymous_namespace)::str1);
  len = std::size<std::basic_string_view<char,std::char_traits<char>>>
                  ((basic_string_view<char,_std::char_traits<char>_> *)(anonymous_namespace)::str1);
  bfy_buffer_add_readonly((bfy_buffer *)&gtest_ar.message_,pvVar2,len);
  pvVar2 = std::data<std::basic_string_view<char,std::char_traits<char>>>
                     ((basic_string_view<char,_std::char_traits<char>_> *)
                      (anonymous_namespace)::str1);
  pcVar3 = bfy_buffer_peek_string((bfy_buffer *)&gtest_ar.message_,(size_t *)0x0);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_a8,"std::data(str1)","bfy_buffer_peek_string(&buf, nullptr)",pvVar2,
             pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x2f5,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  bfy_buffer_destruct((bfy_buffer *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Buffer, peek_string_no_len_arg) {
    auto buf = bfy_buffer_init();
    bfy_buffer_add_readonly(&buf, std::data(str1), std::size(str1));
    EXPECT_STREQ(std::data(str1), bfy_buffer_peek_string(&buf, nullptr));
    bfy_buffer_destruct(&buf);
}